

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O0

uint aom_highbd_sad_skip_64x16_avx2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride)

{
  uint uVar1;
  int i;
  int left_shift;
  uint16_t *refp;
  uint16_t *srcp;
  __m256i sad;
  undefined4 local_d8;
  __m256i *v;
  
  v = (__m256i *)0x0;
  for (local_d8 = 0; local_d8 < 8; local_d8 = local_d8 + 2) {
    sad64x2((uint16_t *)sad[2],sad[1]._4_4_,(uint16_t *)sad[0],srcp._4_4_,refp,_i);
  }
  uVar1 = get_sad_from_mm256_epi32(v);
  return uVar1 << 1;
}

Assistant:

unsigned int aom_highbd_sad16x8_avg_avx2(const uint8_t *src, int src_stride,
                                         const uint8_t *ref, int ref_stride,
                                         const uint8_t *second_pred) {
  __m256i sad = _mm256_setzero_si256();
  uint16_t *srcp = CONVERT_TO_SHORTPTR(src);
  uint16_t *refp = CONVERT_TO_SHORTPTR(ref);
  uint16_t *secp = CONVERT_TO_SHORTPTR(second_pred);

  sad16x4(srcp, src_stride, refp, ref_stride, secp, &sad);

  // Next 4 rows
  srcp += src_stride << 2;
  refp += ref_stride << 2;
  secp += 64;
  sad16x4(srcp, src_stride, refp, ref_stride, secp, &sad);
  return get_sad_from_mm256_epi32(&sad);
}